

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

call_matcher_base<float_&(float_&)> *
trompeloeil::find<float&(float&)>
          (call_matcher_list<float_&(float_&)> *list,call_params_type_t<float_&(float_&)> *p)

{
  bool bVar1;
  uint uVar2;
  call_matcher_base<float_&(float_&)> *pcVar3;
  uint cost;
  call_matcher_base<float_&(float_&)> *i;
  iterator __end0;
  iterator __begin0;
  call_matcher_list<float_&(float_&)> *__range2;
  call_matcher_base<float_&(float_&)> *pcStack_28;
  uint lowest_cost;
  call_matcher_base<float_&(float_&)> *first_match;
  call_params_type_t<float_&(float_&)> *p_local;
  call_matcher_list<float_&(float_&)> *list_local;
  
  pcStack_28 = (call_matcher_base<float_&(float_&)> *)0x0;
  __range2._4_4_ = 0xffffffff;
  __end0 = list<trompeloeil::call_matcher_base<float_&(float_&)>,_trompeloeil::ignore_disposer>::
           begin(&list->
                  super_list<trompeloeil::call_matcher_base<float_&(float_&)>,_trompeloeil::ignore_disposer>
                );
  i = (call_matcher_base<float_&(float_&)> *)
      list<trompeloeil::call_matcher_base<float_&(float_&)>,_trompeloeil::ignore_disposer>::end
                (&list->
                  super_list<trompeloeil::call_matcher_base<float_&(float_&)>,_trompeloeil::ignore_disposer>
                );
  do {
    bVar1 = operator!=(&__end0,(iterator *)&i);
    if (!bVar1) {
      return pcStack_28;
    }
    pcVar3 = list<trompeloeil::call_matcher_base<float_&(float_&)>,_trompeloeil::ignore_disposer>::
             iterator::operator*(&__end0);
    uVar2 = (*(pcVar3->super_list_elem<trompeloeil::call_matcher_base<float_&(float_&)>_>).
              _vptr_list_elem[3])(pcVar3,p);
    if ((uVar2 & 1) != 0) {
      uVar2 = (*(pcVar3->super_list_elem<trompeloeil::call_matcher_base<float_&(float_&)>_>).
                _vptr_list_elem[4])();
      if (uVar2 == 0) {
        return pcVar3;
      }
      if ((pcStack_28 == (call_matcher_base<float_&(float_&)> *)0x0) || (uVar2 < __range2._4_4_)) {
        __range2._4_4_ = uVar2;
        pcStack_28 = pcVar3;
      }
    }
    list<trompeloeil::call_matcher_base<float_&(float_&)>,_trompeloeil::ignore_disposer>::iterator::
    operator++(&__end0);
  } while( true );
}

Assistant:

call_matcher_base <Sig> *
  find(
    call_matcher_list <Sig> &list,
    call_params_type_t <Sig> const &p)
  noexcept
  {
    call_matcher_base<Sig>* first_match = nullptr;
    unsigned lowest_cost = ~0U;
    for (auto& i : list)
    {
      if (i.matches(p))
      {
        unsigned cost = i.sequence_cost();
        if (cost == 0)
        {
          return &i;
        }
        if (!first_match || cost < lowest_cost)
        {
          first_match = &i;
          lowest_cost = cost;
        }
      }
    }
    return first_match;
  }